

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O0

string * __thiscall
t_xsd_generator::xml_autogen_comment_abi_cxx11_
          (string *__return_storage_ptr__,t_xsd_generator *this)

{
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  t_xsd_generator *local_18;
  t_xsd_generator *this_local;
  
  local_18 = this;
  this_local = (t_xsd_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"<!--\n",&local_d9);
  std::operator+(&local_b8,&local_d8," * Autogenerated by Thrift Compiler (");
  std::operator+(&local_98,&local_b8,"0.16.0");
  std::operator+(&local_78,&local_98,")\n");
  std::operator+(&local_58,&local_78," *\n");
  std::operator+(&local_38,&local_58,
                 " * DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING\n");
  std::operator+(__return_storage_ptr__,&local_38," -->\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string xml_autogen_comment() {
    return std::string("<!--\n") + " * Autogenerated by Thrift Compiler (" + THRIFT_VERSION + ")\n"
           + " *\n" + " * DO NOT EDIT UNLESS YOU ARE SURE THAT YOU KNOW WHAT YOU ARE DOING\n"
           + " -->\n";
  }